

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall soplex::SPxMainSM<double>::SPxMainSM(SPxMainSM<double> *this,SPxMainSM<double> *old)

{
  long in_RSI;
  undefined8 *in_RDI;
  VectorBase<double> *in_stack_ffffffffffffff68;
  VectorBase<double> *in_stack_ffffffffffffff70;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_ffffffffffffff78;
  int n;
  DataArray<int> *old_00;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_ffffffffffffff80;
  DataArray<int> *this_00;
  SPxSimplifier<double> *in_stack_ffffffffffffff88;
  SPxSimplifier<double> *in_stack_ffffffffffffff90;
  
  SPxSimplifier<double>::SPxSimplifier(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *in_RDI = &PTR__SPxMainSM_004ec7c8;
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_ffffffffffffff80,(DataArray<int> *)in_stack_ffffffffffffff78
            );
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_ffffffffffffff80,(DataArray<int> *)in_stack_ffffffffffffff78
            );
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::Array
            ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
             in_stack_ffffffffffffff80,
             (Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
             in_stack_ffffffffffffff78);
  n = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)in_stack_ffffffffffffff80,n);
  this_00 = (DataArray<int> *)(in_RDI + 0x2a);
  Array<soplex::DSVectorBase<double>_>::Array((Array<soplex::DSVectorBase<double>_> *)this_00,n);
  old_00 = (DataArray<int> *)(in_RDI + 0x2d);
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)this_00,(int)((ulong)old_00 >> 0x20));
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)this_00,(int)((ulong)old_00 >> 0x20));
  *(byte *)(in_RDI + 0x33) = *(byte *)(in_RSI + 0x198) & 1;
  DataArray<int>::DataArray(this_00,old_00);
  *(undefined4 *)(in_RDI + 0x37) = *(undefined4 *)(in_RSI + 0x1b8);
  *(byte *)((long)in_RDI + 0x1bc) = *(byte *)(in_RSI + 0x1bc) & 1;
  *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RSI + 0x1c0);
  *(undefined4 *)((long)in_RDI + 0x1c4) = *(undefined4 *)(in_RSI + 0x1c4);
  in_RDI[0x39] = *(undefined8 *)(in_RSI + 0x1c8);
  in_RDI[0x3a] = *(undefined8 *)(in_RSI + 0x1d0);
  return;
}

Assistant:

SPxMainSM(const SPxMainSM& old)
      : SPxSimplifier<R>(old)
      , m_prim(old.m_prim)
      , m_slack(old.m_slack)
      , m_dual(old.m_dual)
      , m_redCost(old.m_redCost)
      , m_cBasisStat(old.m_cBasisStat)
      , m_rBasisStat(old.m_rBasisStat)
      , m_cIdx(old.m_cIdx)
      , m_rIdx(old.m_rIdx)
      , m_hist(old.m_hist)
      , m_postsolved(old.m_postsolved)
      , m_stat(old.m_stat)
      , m_thesense(old.m_thesense)
      , m_keepbounds(old.m_keepbounds)
      , m_addedcols(old.m_addedcols)
      , m_result(old.m_result)
      , m_cutoffbound(old.m_cutoffbound)
      , m_pseudoobj(old.m_pseudoobj)
   {
      ;
   }